

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
booster::locale::details::format_parser::set_flag_with_str<char>
          (format_parser *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  bool bVar1;
  ios_info *this_00;
  tm *in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__format;
  char *__maxsize;
  
  __maxsize = "ftime";
  bVar1 = std::operator==(key,"ftime");
  __format = extraout_RDX;
  if (!bVar1) {
    __maxsize = "strftime";
    bVar1 = std::operator==(key,"strftime");
    __format = extraout_RDX_00;
    if (!bVar1) {
      return;
    }
  }
  as::strftime(*(char **)this,(size_t)__maxsize,__format,in_RCX);
  this_00 = (ios_info *)booster::locale::ios_info::get(*(ios_base **)this);
  ios_info::date_time_pattern<char>(this_00,value);
  return;
}

Assistant:

void set_flag_with_str(std::string const &key,std::basic_string<CharType> const &value)
                {
                    if(key=="ftime" || key=="strftime") {
                        as::strftime(ios_);
                        ios_info::get(ios_).date_time_pattern(value);
                    }
                }